

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O1

void scbitrevR2(float *ioptr,long M,short *BRLow,float scale)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float *pfVar19;
  long lVar20;
  float *pfVar21;
  ulong uVar22;
  float *pfVar23;
  long lVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  
  uVar12 = (ulong)((uint)((int)(M + 3) - (int)(M + 3 >> 0x3f)) >> 1);
  if (0 < 4L << (uVar12 & 0x3f)) {
    lVar14 = 1L << (uVar12 & 0x3f);
    lVar13 = 1L << (M & 0x3fU);
    lVar20 = lVar13 - lVar14;
    uVar25 = ~(-1L << ((ulong)((int)(M / 2) - 1) & 0x3f));
    pfVar1 = ioptr + lVar14;
    lVar16 = 1L << ((ulong)(byte)((char)(M / 2) + 1) & 0x3f);
    local_78 = ioptr + (lVar13 - lVar14);
    local_88 = ioptr + ((lVar13 * 2 + 1) - lVar14);
    local_70 = ioptr + lVar14 * -2 + lVar13;
    local_80 = ioptr + lVar14 * -2 + lVar13 * 2;
    uVar12 = uVar25;
    do {
      do {
        lVar24 = (long)BRLow[uVar12];
        pfVar19 = ioptr + lVar20 + lVar24 * 4;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)(ioptr + lVar20 + lVar24 * 4);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(pfVar19 + lVar13);
        if ((long)uVar12 < (long)uVar25) {
          lVar17 = uVar12 << (((M + 1) - (M + 1 >> 0x3f) >> 1) + 1U & 0x3f);
          auVar27 = vmovlhps_avx(auVar29,auVar26);
          pfVar15 = local_88;
          pfVar19 = local_70;
          uVar22 = uVar25;
          pfVar23 = local_80;
          pfVar21 = local_78;
          do {
            lVar18 = (long)BRLow[uVar22];
            auVar36 = vshufpd_avx(auVar27,auVar27,1);
            auVar28 = vsubps_avx(auVar27,auVar36);
            uVar3 = *(undefined8 *)(pfVar21 + lVar24 * 4 + 2);
            auVar30._8_8_ = uVar3;
            auVar30._0_8_ = uVar3;
            uVar4 = *(undefined8 *)(pfVar15 + lVar24 * 4 + 1);
            auVar31._8_8_ = uVar4;
            auVar31._0_8_ = uVar4;
            auVar30 = vsubps_avx(auVar30,auVar31);
            uVar5 = *(ulong *)(ioptr + lVar17 + lVar18 * 4);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar5;
            uVar6 = *(ulong *)(ioptr + lVar17 + lVar18 * 4 + 2);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = uVar6;
            uVar7 = *(ulong *)(ioptr + lVar17 + lVar18 * 4 + lVar13);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar7;
            uVar8 = *(ulong *)(ioptr + lVar17 + lVar18 * 4 + lVar13 + 2);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar8;
            auVar40._0_4_ = (float)uVar8 + (float)uVar6;
            auVar40._4_4_ = (float)(uVar8 >> 0x20) + (float)(uVar6 >> 0x20);
            auVar40._8_8_ = 0;
            auVar26 = vmovshdup_avx(auVar40);
            auVar31 = vsubps_avx(auVar34,auVar37);
            auVar38._0_4_ = (float)uVar7 + (float)uVar5;
            auVar38._4_4_ = (float)(uVar7 >> 0x20) + (float)(uVar5 >> 0x20);
            auVar38._8_8_ = 0;
            auVar29 = vmovshdup_avx(auVar38);
            auVar32 = vsubps_avx(auVar32,auVar35);
            auVar33._0_4_ = auVar32._0_4_ * scale;
            auVar33._4_4_ = auVar32._4_4_ * scale;
            auVar33._8_4_ = auVar32._8_4_ * scale;
            auVar33._12_4_ = auVar32._12_4_ * scale;
            pfVar2 = ioptr + lVar17 + lVar18 * 4;
            *pfVar2 = (auVar27._0_4_ + auVar36._0_4_) * scale;
            pfVar2[1] = (auVar27._4_4_ + auVar36._4_4_) * scale;
            pfVar2[2] = auVar28._8_4_ * scale;
            pfVar2[3] = auVar28._12_4_ * scale;
            pfVar2 = ioptr + lVar17 + lVar18 * 4 + lVar13;
            *pfVar2 = ((float)uVar4 + (float)uVar3) * scale;
            pfVar2[1] = ((float)((ulong)uVar4 >> 0x20) + (float)((ulong)uVar3 >> 0x20)) * scale;
            pfVar2[2] = auVar30._8_4_ * scale;
            pfVar2[3] = auVar30._12_4_ * scale;
            pfVar21[lVar24 * 4] = auVar38._0_4_ * scale;
            pfVar21[lVar24 * 4 + 1] = auVar29._0_4_ * scale;
            uVar3 = vmovlps_avx(auVar33);
            *(undefined8 *)(pfVar21 + lVar24 * 4 + 2) = uVar3;
            pfVar15[lVar24 * 4 + -1] = auVar40._0_4_ * scale;
            pfVar15[lVar24 * 4] = auVar26._0_4_ * scale;
            auVar27._0_4_ = auVar31._0_4_ * scale;
            auVar27._4_4_ = auVar31._4_4_ * scale;
            auVar27._8_4_ = auVar31._8_4_ * scale;
            auVar27._12_4_ = auVar31._12_4_ * scale;
            uVar3 = vmovlps_avx(auVar27);
            *(undefined8 *)(pfVar15 + lVar24 * 4 + 1) = uVar3;
            uVar22 = uVar22 - 1;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = *(ulong *)(pfVar19 + lVar24 * 4);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *(ulong *)(pfVar23 + lVar24 * 4);
            auVar27 = vmovlhps_avx(auVar29,auVar26);
            pfVar21 = pfVar21 + -lVar14;
            pfVar15 = pfVar15 + -lVar14;
            pfVar19 = pfVar19 + -lVar14;
            pfVar23 = pfVar23 + -lVar14;
          } while ((long)uVar12 < (long)uVar22);
          auVar27 = vmovshdup_avx(auVar29);
          fVar10 = auVar27._0_4_;
          auVar27 = vmovshdup_avx(auVar26);
          fVar11 = auVar27._0_4_;
          pfVar19 = pfVar21 + lVar24 * 4;
          pfVar21 = pfVar21 + lVar24 * 4 + 1;
          pfVar23 = pfVar15 + lVar24 * 4;
          pfVar15 = pfVar15 + lVar24 * 4 + -1;
        }
        else {
          pfVar21 = ioptr + lVar20 + lVar24 * 4 + 1;
          auVar27 = vmovshdup_avx(auVar26);
          fVar11 = auVar27._0_4_;
          pfVar15 = pfVar19 + lVar13;
          pfVar23 = pfVar19 + lVar13 + 1;
          auVar27 = vmovshdup_avx(auVar29);
          fVar10 = auVar27._0_4_;
        }
        uVar22 = *(ulong *)(pfVar19 + 2);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar22;
        uVar5 = *(ulong *)(pfVar19 + lVar13 + 2);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar5;
        auVar41._0_4_ = (float)uVar5 + (float)uVar22;
        auVar41._4_4_ = (float)(uVar5 >> 0x20) + (float)(uVar22 >> 0x20);
        auVar41._8_8_ = 0;
        auVar27 = vmovshdup_avx(auVar41);
        auVar36 = vsubps_avx(auVar36,auVar39);
        *pfVar19 = (auVar29._0_4_ + auVar26._0_4_) * scale;
        *pfVar21 = (fVar10 + fVar11) * scale;
        pfVar19[2] = (auVar26._0_4_ - auVar29._0_4_) * scale;
        pfVar19[3] = (fVar11 - fVar10) * scale;
        *pfVar15 = auVar41._0_4_ * scale;
        *pfVar23 = auVar27._0_4_ * scale;
        auVar28._0_4_ = auVar36._0_4_ * scale;
        auVar28._4_4_ = auVar36._4_4_ * scale;
        auVar28._8_4_ = auVar36._8_4_ * scale;
        auVar28._12_4_ = auVar36._12_4_ * scale;
        uVar3 = vmovlps_avx(auVar28);
        *(undefined8 *)(pfVar19 + lVar13 + 2) = uVar3;
        bVar9 = 0 < (long)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar9);
      ioptr = ioptr + lVar16;
      local_78 = local_78 + lVar16;
      local_88 = local_88 + lVar16;
      local_70 = local_70 + lVar16;
      local_80 = local_80 + lVar16;
      uVar12 = uVar25;
    } while (ioptr < pfVar1);
  }
  return;
}

Assistant:

static inline void scbitrevR2(float *ioptr, long M, short *BRLow, float scale) {
/*** scaled bit reverse and first radix 2 stage forward or inverse fft ***/
float	f0r;
float	f0i;
float	f1r;
float	f1i;
float	f2r;
float	f2i;
float	f3r;
float	f3i;
float	f4r;
float	f4i;
float	f5r;
float	f5i;
float	f6r;
float	f6i;
float	f7r;
float	f7i;
float	t0r;
float	t0i;
float	t1r;
float	t1i;
float	*p0r;
float	*p1r;
float	*IOP;
float 	*iolimit;
long 	Colstart;
long 	iCol;
unsigned long 	posA;
unsigned long 	posAi;
unsigned long 	posB;
unsigned long 	posBi;

const unsigned long Nrems2 = POW2((M+3)/2);
const unsigned long Nroot_1_ColInc = POW2(M)-Nrems2;
const unsigned long Nroot_1 = POW2(M/2-1)-1;
const unsigned long ColstartShift = (M+1)/2 +1;
posA = POW2(M);		// 1/2 of POW2(M) complexes
posAi = posA + 1;
posB = posA + 2;
posBi = posB + 1;

iolimit = ioptr + Nrems2;
for (; ioptr < iolimit; ioptr += POW2(M/2+1)){
	for (Colstart = Nroot_1; Colstart >= 0; Colstart--){
		iCol = Nroot_1;
		p0r = ioptr+ Nroot_1_ColInc + BRLow[Colstart]*4;
		IOP = ioptr + (Colstart << ColstartShift);
		p1r = IOP + BRLow[iCol]*4;
		f0r = *(p0r);
		f0i = *(p0r+1);
		f1r = *(p0r+posA);
		f1i = *(p0r+posAi);
		for (; iCol > Colstart;){
			f2r = *(p0r+2);
			f2i = *(p0r+(2+1));
			f3r = *(p0r+posB);
			f3i = *(p0r+posBi);
			f4r = *(p1r);
			f4i = *(p1r+1);
			f5r = *(p1r+posA);
			f5i = *(p1r+posAi);
			f6r = *(p1r+2);
			f6i = *(p1r+(2+1));
			f7r = *(p1r+posB);
			f7i = *(p1r+posBi);
			
			t0r	= f0r + f1r;
			t0i	= f0i + f1i;
			f1r = f0r - f1r;
			f1i = f0i - f1i;
			t1r = f2r + f3r;
			t1i = f2i + f3i;
			f3r = f2r - f3r;
			f3i = f2i - f3i;
			f0r = f4r + f5r;
			f0i = f4i + f5i;
			f5r = f4r - f5r;
			f5i = f4i - f5i;
			f2r = f6r + f7r;
			f2i = f6i + f7i;
			f7r = f6r - f7r;
			f7i = f6i - f7i;

			*(p1r) = scale*t0r;
			*(p1r+1) = scale*t0i;
			*(p1r+2) = scale*f1r;
			*(p1r+(2+1)) = scale*f1i;
			*(p1r+posA) = scale*t1r;
			*(p1r+posAi) = scale*t1i;
			*(p1r+posB) = scale*f3r;
			*(p1r+posBi) = scale*f3i;
			*(p0r) = scale*f0r;
			*(p0r+1) = scale*f0i;
			*(p0r+2) = scale*f5r;
			*(p0r+(2+1)) = scale*f5i;
			*(p0r+posA) = scale*f2r;
			*(p0r+posAi) = scale*f2i;
			*(p0r+posB) = scale*f7r;
			*(p0r+posBi) = scale*f7i;

			p0r -= Nrems2;
			f0r = *(p0r);
			f0i = *(p0r+1);
			f1r = *(p0r+posA);
			f1i = *(p0r+posAi);
			iCol -= 1;
			p1r = IOP + BRLow[iCol]*4;
		};
		f2r = *(p0r+2);
		f2i = *(p0r+(2+1));
		f3r = *(p0r+posB);
		f3i = *(p0r+posBi);

		t0r   = f0r + f1r;
		t0i   = f0i + f1i;
		f1r = f0r - f1r;
		f1i = f0i - f1i;
		t1r   = f2r + f3r;
		t1i   = f2i + f3i;
		f3r = f2r - f3r;
		f3i = f2i - f3i;

		*(p0r) = scale*t0r;
		*(p0r+1) = scale*t0i;
		*(p0r+2) = scale*f1r;
		*(p0r+(2+1)) = scale*f1i;
		*(p0r+posA) = scale*t1r;
		*(p0r+posAi) = scale*t1i;
		*(p0r+posB) = scale*f3r;
		*(p0r+posBi) = scale*f3i;

	};
};
}